

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O1

void __thiscall UCAFL::_may_use_shm_testcase(UCAFL *this)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  uint32_t *puVar4;
  char *pcVar5;
  long lVar6;
  uint8_t *puVar7;
  cmp_map *pcVar8;
  bool bVar9;
  UCAFL *this_00;
  uint32_t uVar10;
  double __x;
  double extraout_XMM0_Qa;
  double __x_00;
  double dVar11;
  double extraout_XMM0_Qa_00;
  
  pcVar3 = getenv("__AFL_SHM_FUZZ_ID");
  if (pcVar3 == (char *)0x0) {
    this->afl_use_shm_testcase_ = false;
    log(__x);
    return;
  }
  uVar1 = atoi(pcVar3);
  this_00 = (UCAFL *)(ulong)uVar1;
  puVar4 = (uint32_t *)shmat(uVar1,(void *)0x0,0);
  if (1 < (long)puVar4 + 1U) {
    this->afl_testcase_len_p_ = puVar4;
    this->afl_testcase_ptr_ = puVar4 + 1;
    this->afl_use_shm_testcase_ = true;
    return;
  }
  _may_use_shm_testcase();
  pcVar3 = getenv("__AFL_SHM_ID");
  pcVar5 = getenv("AFL_INST_RATIO");
  this_00->wifsignaled_ = 1;
  uVar10 = 0x10000;
  if (pcVar5 != (char *)0x0) {
    lVar6 = atol(pcVar5);
    uVar1 = (uint)lVar6;
    if (uVar1 < 0x65) {
      uVar10 = ((uVar1 + (uVar1 == 0)) * 0x10000) / 100;
    }
  }
  this_00->afl_inst_rms_ = uVar10;
  if (pcVar3 == (char *)0x0) {
    _afl_setup(this_00);
  }
  else {
    iVar2 = atoi(pcVar3);
    puVar7 = (uint8_t *)shmat(iVar2,(void *)0x0,0);
    this_00->afl_area_ptr_ = puVar7;
    dVar11 = extraout_XMM0_Qa;
    if (puVar7 == (uint8_t *)0xffffffffffffffff) goto LAB_0010301a;
    this_00->has_afl_ = true;
    *puVar7 = '\x01';
  }
  pcVar3 = getenv("__AFL_CMPLOG_SHM_ID");
  pcVar5 = getenv("UNICORN_AFL_CMPCOV");
  this_00->has_cmpcov_ = pcVar5 != (char *)0x0;
  if (pcVar3 == (char *)0x0) {
    bVar9 = false;
  }
  else {
    if (pcVar5 != (char *)0x0) {
      dVar11 = log(__x_00);
      log(dVar11);
      this_00->has_cmpcov_ = false;
    }
    iVar2 = atoi(pcVar3);
    pcVar8 = (cmp_map *)shmat(iVar2,(void *)0x0,0);
    this_00->cmpmap_ = pcVar8;
    bVar9 = true;
    dVar11 = extraout_XMM0_Qa_00;
    if (pcVar8 == (cmp_map *)0xffffffffffffffff) {
LAB_0010301a:
      log(dVar11);
      exit(0);
    }
  }
  this_00->has_cmplog_ = bVar9;
  return;
}

Assistant:

void _may_use_shm_testcase() {
        char* id_str = getenv(SHM_FUZZ_ENV_VAR);

        if (id_str) {
            int shm_id = atoi(id_str);
            uint32_t* map = (uint32_t*)shmat(shm_id, NULL, 0);
            if (!map || map == MAP_FAILED) {
                perror("[!] could not access fuzzing shared memory");
                exit(1);
            }

            this->afl_testcase_len_p_ = map;
            this->afl_testcase_ptr_ = map + 1;
            this->afl_use_shm_testcase_ = true;
            return;
        } else {
            this->afl_use_shm_testcase_ = false;
            ERR("SHARED MEMORY FUZZING Feature is not enabled.\n");
            return;
        }
    }